

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O3

opj_bool opj_stream_read_seek
                   (opj_stream_private_t *p_stream,OPJ_OFF_T p_size,opj_event_mgr_t *p_event_mgr)

{
  opj_bool oVar1;
  
  p_stream->m_current_data = p_stream->m_stored_data;
  p_stream->m_bytes_in_buffer = 0;
  oVar1 = (*p_stream->m_seek_fn)(p_size,p_stream->m_user_data);
  if (oVar1 == 0) {
    p_stream->m_status = p_stream->m_status & 0xfffffffb;
    p_stream->m_byte_offset = p_size;
  }
  else {
    p_stream->m_status = p_stream->m_status | 4;
  }
  return (uint)(oVar1 != 0);
}

Assistant:

opj_bool opj_stream_read_seek (opj_stream_private_t * p_stream, OPJ_OFF_T p_size, opj_event_mgr_t * p_event_mgr)
{
	OPJ_ARG_NOT_USED(p_event_mgr);
	p_stream->m_current_data = p_stream->m_stored_data;
	p_stream->m_bytes_in_buffer = 0;

	if( p_stream->m_seek_fn(p_size,p_stream->m_user_data)) {
		p_stream->m_status |= opj_stream_e_end;
		return EXIT_FAILURE;
	}
	else {
		// reset stream status
		p_stream->m_status &= (~opj_stream_e_end);
		p_stream->m_byte_offset = p_size;

	}

	return EXIT_SUCCESS;
}